

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

void mpp_av1_fragment_reset(Av1UnitFragment *frag)

{
  Av1ObuUnit *pAVar1;
  Av1ObuUnit *unit;
  int i;
  Av1UnitFragment *frag_local;
  
  for (unit._4_4_ = 0; unit._4_4_ < frag->nb_units; unit._4_4_ = unit._4_4_ + 1) {
    pAVar1 = frag->units;
    if (pAVar1[unit._4_4_].content != (void *)0x0) {
      mpp_osal_free("mpp_av1_fragment_reset",pAVar1[unit._4_4_].content);
    }
    pAVar1[unit._4_4_].content = (void *)0x0;
    pAVar1[unit._4_4_].data = (RK_U8 *)0x0;
    pAVar1[unit._4_4_].data_size = 0;
  }
  frag->nb_units = 0;
  frag->data = (RK_U8 *)0x0;
  frag->data_size = 0;
  return;
}

Assistant:

void mpp_av1_fragment_reset(Av1UnitFragment *frag)
{
    int i;

    for (i = 0; i < frag->nb_units; i++) {
        Av1ObuUnit *unit = &frag->units[i];
        MPP_FREE(unit->content);
        unit->data             = NULL;
        unit->data_size        = 0;
    }
    frag->nb_units         = 0;
    frag->data             = NULL;
    frag->data_size        = 0;
}